

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O3

int wally_psbt_extract(wally_psbt *psbt,wally_tx **output)

{
  wally_tx *tx;
  wally_psbt_input *pwVar1;
  wally_tx_input *pwVar2;
  uchar *src;
  _Bool _Var3;
  int iVar4;
  wally_tx_witness_stack *stack;
  long lVar5;
  long lVar6;
  wally_tx *result;
  wally_tx *local_40;
  ulong local_38;
  
  local_40 = (wally_tx *)0x0;
  iVar4 = -2;
  if (((((output != (wally_tx **)0x0) && (*output = (wally_tx *)0x0, psbt != (wally_psbt *)0x0)) &&
       (tx = psbt->tx, tx != (wally_tx *)0x0)) &&
      ((psbt->num_inputs != 0 && (psbt->num_outputs != 0)))) &&
     ((tx->num_inputs == psbt->num_inputs &&
      ((tx->num_outputs == psbt->num_outputs &&
       (iVar4 = wally_tx_clone_alloc(tx,0,&local_40), iVar4 == 0)))))) {
    if (psbt->num_inputs != 0) {
      lVar5 = 0x38;
      lVar6 = 0x40;
      local_38 = 0;
      do {
        pwVar1 = psbt->inputs;
        pwVar2 = local_40->inputs;
        src = *(uchar **)((long)pwVar1 + lVar6 + -0x10);
        if (src == (uchar *)0x0) {
          stack = *(wally_tx_witness_stack **)((long)&pwVar1->utxo + lVar6);
          if (stack != (wally_tx_witness_stack *)0x0) {
LAB_004a4796:
            if (*(long *)(pwVar2->txhash + lVar5) == 0) {
              iVar4 = wally_tx_witness_stack_clone_alloc
                                (stack,(wally_tx_witness_stack **)(pwVar2->txhash + lVar5));
              if (iVar4 != 0) goto LAB_004a47e8;
              goto LAB_004a47b1;
            }
          }
LAB_004a47d8:
          iVar4 = -2;
LAB_004a47e8:
          wally_tx_free(local_40);
          return iVar4;
        }
        if (*(long *)(pwVar2->txhash + lVar5 + -0x10) != 0) goto LAB_004a47d8;
        _Var3 = clone_bytes((uchar **)(pwVar2->txhash + lVar5 + -0x10),src,
                            *(size_t *)((long)pwVar1 + lVar6 + -8));
        if (!_Var3) {
          iVar4 = -3;
          goto LAB_004a47e8;
        }
        *(undefined8 *)(pwVar2->txhash + lVar5 + -8) = *(undefined8 *)((long)pwVar1 + lVar6 + -8);
        stack = *(wally_tx_witness_stack **)((long)&pwVar1->utxo + lVar6);
        if (stack != (wally_tx_witness_stack *)0x0) goto LAB_004a4796;
LAB_004a47b1:
        local_38 = local_38 + 1;
        lVar5 = lVar5 + 0xd0;
        lVar6 = lVar6 + 0x110;
      } while (local_38 < psbt->num_inputs);
    }
    *output = local_40;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int wally_psbt_extract(const struct wally_psbt *psbt, struct wally_tx **output)
{
    struct wally_tx *result = NULL;
    size_t i;
    int ret;

    TX_CHECK_OUTPUT;

    if (!psbt || !psbt->tx || !psbt->num_inputs || !psbt->num_outputs ||
        psbt->tx->num_inputs != psbt->num_inputs ||
        psbt->tx->num_outputs != psbt->num_outputs)
        return WALLY_EINVAL;

    if ((ret = tx_clone_alloc(psbt->tx, &result)) != WALLY_OK)
        return ret;

    for (i = 0; i < psbt->num_inputs; ++i) {
        const struct wally_psbt_input *input = &psbt->inputs[i];
        struct wally_tx_input *tx_input = &result->inputs[i];

        if (!input->final_scriptsig && !input->final_witness) {
            ret = WALLY_EINVAL;
            break;
        }

        if (input->final_scriptsig) {
            if (tx_input->script) {
                /* Our global tx shouldn't have a scriptSig */
                ret = WALLY_EINVAL;
                break;
            }
            if (!clone_bytes(&tx_input->script,
                             input->final_scriptsig,
                             input->final_scriptsig_len)) {
                ret = WALLY_ENOMEM;
                break;
            }
            tx_input->script_len = input->final_scriptsig_len;
        }
        if (input->final_witness) {
            if (tx_input->witness) {
                /* Our global tx shouldn't have a witness */
                ret = WALLY_EINVAL;
                break;
            }
            ret = wally_tx_witness_stack_clone_alloc(input->final_witness,
                                                     &tx_input->witness);
            if (ret != WALLY_OK)
                break;
        }
    }

    if (ret == WALLY_OK)
        *output = result;
    else
        wally_tx_free(result);
    return ret;
}